

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> __thiscall
phosg::popen_unique(phosg *this,string *command,string *mode)

{
  char *__command;
  char *__modes;
  FILE *__p;
  pointer p_Var1;
  cannot_open_file *this_00;
  _Head_base<0UL,__IO_FILE_*,_false> extraout_RDX;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> uVar2;
  __0 local_31;
  _func_void_FILE_ptr *local_30;
  undefined1 local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *mode_local;
  string *command_local;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *f;
  
  local_21 = 0;
  local_20 = mode;
  mode_local = command;
  command_local = (string *)this;
  __command = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              c_str(command);
  __modes = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      (local_20);
  __p = popen(__command,__modes);
  local_30 = popen_unique(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0::
             operator_cast_to_function_pointer(&local_31);
  ::std::unique_ptr<_IO_FILE,void(*)(_IO_FILE*)>::unique_ptr<void(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,void(*)(_IO_FILE*)> *)this,(pointer)__p,
             (__enable_if_t<_is_lvalue_reference<void_(*)(_IO_FILE_*)>::value,_void_(*&&)(_IO_FILE_*)>
              )&local_30);
  p_Var1 = ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                     ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)this);
  if (p_Var1 != (pointer)0x0) {
    uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
    super__Tuple_impl<1UL,_void_(*)(_IO_FILE_*)>.super__Head_base<1UL,_void_(*)(_IO_FILE_*),_false>.
    _M_head_impl = (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)
                   (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)this;
    return (unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>)
           uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
           super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>;
  }
  this_00 = (cannot_open_file *)__cxa_allocate_exception(0x20);
  cannot_open_file::cannot_open_file(this_00,(string *)mode_local);
  __cxa_throw(this_00,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

unique_ptr<FILE, void (*)(FILE*)> popen_unique(const string& command,
    const string& mode) {
  unique_ptr<FILE, void (*)(FILE*)> f(
      popen(command.c_str(), mode.c_str()),
      [](FILE* f) {
        pclose(f);
      });
  if (!f.get()) {
    throw cannot_open_file(command);
  }
  return f;
}